

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_minimal.cpp
# Opt level: O3

int main(void)

{
  node *pnVar1;
  long *plVar2;
  point_wrapper<float[3]> p;
  initializer_list<std::array<float,_3UL>_> __l;
  float query [3];
  search_nn<pico_tree::neighbor<int,_float>_> v;
  neighbor<int,_float> nn;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> points;
  max_leaf_size_t max_leaf_size;
  kd_tree<std::reference_wrapper<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>,_pico_tree::metric_l2_squared,_int>
  tree;
  undefined8 local_108;
  undefined4 local_100;
  int *local_f8;
  int local_f0;
  undefined4 local_ec;
  void *local_e8 [2];
  long local_d8;
  undefined8 local_d0;
  undefined1 local_c8 [8];
  undefined8 uStack_c0;
  kd_tree_data_type local_b8;
  search_nearest_euclidean<pico_tree::internal::space_wrapper<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>,_pico_tree::metric_l2_squared,_pico_tree::internal::point_wrapper<float[3]>,_pico_tree::internal::search_nn<pico_tree::neighbor<int,_float>_>,_int>
  local_60;
  
  local_d0 = 0xc;
  local_c8._0_4_ = 0.0;
  local_c8._4_4_ = 1.0;
  uStack_c0 = 0x4040000040000000;
  local_b8.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x40a0000040800000;
  __l._M_len = 2;
  __l._M_array = (iterator)local_c8;
  std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::vector
            ((space_type *)local_e8,__l,(allocator_type *)&local_60);
  local_c8 = (undefined1  [8])local_e8;
  pico_tree::internal::
  build_kd_tree<pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,float>,3ul>,3ul>
  ::operator()(&local_b8,&local_60,(space_type *)local_e8,
               (splitter_stop_condition_t<pico_tree::max_leaf_size_t> *)&local_d0,
               (splitter_start_bounds_t<pico_tree::bounds_from_space_t> *)&local_108,
               (splitter_rule_t<pico_tree::sliding_midpoint_max_side_t> *)&local_f8);
  local_108 = 0x4080000040800000;
  local_100 = 0x40800000;
  local_f8 = &local_f0;
  local_ec = 0x7f7fffff;
  local_60.space_.space_ = (space_type *)local_c8;
  local_60.node_box_offset_.elems_._M_elems[0] = 0.0;
  local_60.node_box_offset_.elems_._M_elems[1] = 0.0;
  local_60.node_box_offset_.elems_._M_elems[2] = 0.0;
  local_60.indices_ = &local_b8.indices;
  local_60.query_.point_ = (point_type *)&local_108;
  local_60.visitor_ = (search_nn<pico_tree::neighbor<int,_float>_> *)&local_f8;
  pico_tree::internal::
  search_nearest_euclidean<pico_tree::internal::space_wrapper<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>,_pico_tree::metric_l2_squared,_pico_tree::internal::point_wrapper<float[3]>,_pico_tree::internal::search_nn<pico_tree::neighbor<int,_float>_>,_int>
  ::search_nearest(&local_60,local_b8.root_node,0.0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Index closest point: ",0x15);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_f0);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  local_b8.allocator.resource_._vptr_list_pool_resource =
       (_func_int **)&PTR__list_pool_resource_00104d98;
  while (local_b8.allocator.resource_.head_ != (node *)0x0) {
    pnVar1 = (local_b8.allocator.resource_.head_)->prev;
    operator_delete(local_b8.allocator.resource_.head_,0x2008);
    local_b8.allocator.resource_.head_ = pnVar1;
  }
  if (local_b8.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_b8.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_e8[0] != (void *)0x0) {
    operator_delete(local_e8[0],local_d8 - (long)local_e8[0]);
  }
  return 0;
}

Assistant:

int main() {
  pico_tree::max_leaf_size_t max_leaf_size = 12;
  std::vector<std::array<float, 3>> points{
      {0.0f, 1.0f, 2.0f}, {3.0f, 4.0f, 5.0f}};

  // The kd_tree takes the input by value. To prevent a copy, we can either move
  // the point set into the tree or the point set can be taken by reference by
  // wrapping it in an std::reference_wrapper. Below we take the input by
  // reference:
  pico_tree::kd_tree tree(std::ref(points), max_leaf_size);

  float query[3] = {4.0f, 4.0f, 4.0f};
  pico_tree::neighbor<int, float> nn;
  tree.search_nn(query, nn);

  std::cout << "Index closest point: " << nn.index << std::endl;

  return 0;
}